

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_main.c
# Opt level: O1

int sys_argparse(int argc,char **argv)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  t_namelist *ptVar4;
  int *piVar5;
  uint i;
  uint uVar6;
  char *pcVar7;
  long lVar8;
  char **ppcVar9;
  t_fontinfo *ptVar10;
  char *pcVar11;
  int *piVar12;
  int *piVar13;
  double dVar14;
  t_audiosettings as;
  float f;
  t_audiosettings local_98;
  float local_34;
  
  sys_get_audio_settings(&local_98);
  if (0 < argc) {
    do {
      if (**argv != '-') break;
      iVar3 = strcmp(*argv,"-r");
      if (((argc != 1) && (iVar3 == 0)) &&
         (iVar3 = __isoc99_sscanf(argv[1],"%d",&local_98.a_srate), 0 < iVar3)) goto LAB_00176241;
      pcVar7 = *argv;
      iVar3 = strcmp(pcVar7,"-inchannels");
      if (iVar3 == 0) {
        if (argc == 1) goto LAB_00176be7;
        pcVar7 = argv[1];
        piVar5 = &local_98.a_nchindev;
        piVar12 = local_98.a_chindevvec;
LAB_0017622f:
        iVar3 = sys_parsedevlist(piVar5,piVar12,4,pcVar7);
joined_r0x0017662d:
        if (iVar3 == 0) {
LAB_00176be7:
          sys_printusage();
          return 1;
        }
LAB_00176241:
        argc = argc + -2;
        argv = argv + 2;
      }
      else {
        iVar3 = strcmp(pcVar7,"-outchannels");
        if (iVar3 == 0) {
          if (argc == 1) goto LAB_00176be7;
LAB_00176221:
          pcVar7 = argv[1];
          piVar5 = &local_98.a_nchoutdev;
          piVar12 = local_98.a_choutdevvec;
          goto LAB_0017622f;
        }
        iVar3 = strcmp(pcVar7,"-channels");
        if (iVar3 == 0) {
          if ((argc == 1) ||
             (iVar3 = sys_parsedevlist(&local_98.a_nchindev,local_98.a_chindevvec,4,argv[1]),
             iVar3 == 0)) goto LAB_00176be7;
          goto LAB_00176221;
        }
        iVar3 = strcmp(pcVar7,"-soundbuf");
        if ((iVar3 == 0) || (iVar3 = strcmp(pcVar7,"-audiobuf"), iVar3 == 0)) {
          if (argc == 1) goto LAB_00176be7;
          local_98.a_advance = atoi(argv[1]);
          goto LAB_00176241;
        }
        iVar3 = strcmp(pcVar7,"-callback");
        if (iVar3 != 0) {
          iVar3 = strcmp(pcVar7,"-nocallback");
          if (iVar3 == 0) {
            local_98.a_callback = 0;
            goto LAB_001763f8;
          }
          iVar3 = strcmp(pcVar7,"-blocksize");
          if (iVar3 != 0) {
            iVar3 = strcmp(pcVar7,"-sleepgrain");
            if (iVar3 == 0) {
              if (argc == 1) goto LAB_00176be7;
              dVar14 = atof(argv[1]);
              iVar3 = (int)(dVar14 * 1000.0);
              piVar5 = &sys_sleepgrain;
LAB_001762a3:
              *piVar5 = iVar3;
              goto LAB_00176241;
            }
            iVar3 = strcmp(pcVar7,"-nodac");
            if (iVar3 == 0) {
LAB_001762b5:
              local_98.a_nchoutdev = 0;
              local_98.a_noutdev = 0;
              goto LAB_001763f8;
            }
            iVar3 = strcmp(pcVar7,"-noadc");
            if (iVar3 == 0) {
              local_98.a_nchindev = 0;
              local_98.a_nindev = 0;
              goto LAB_001763f8;
            }
            iVar3 = strcmp(pcVar7,"-nosound");
            if ((iVar3 == 0) || (iVar3 = strcmp(pcVar7,"-noaudio"), iVar3 == 0)) {
              local_98.a_nchindev = 0;
              local_98.a_nindev = 0;
              goto LAB_001762b5;
            }
            iVar3 = strcmp(pcVar7,"-oss");
            if ((iVar3 == 0) || (iVar3 = strcmp(pcVar7,"-ossmidi"), iVar3 == 0)) {
              pcVar11 = "Pd compiled without OSS-support, ignoring \'%s\' flag\n";
LAB_001763ee:
              fprintf(_stderr,pcVar11,pcVar7);
              goto LAB_001763f8;
            }
            iVar3 = strcmp(pcVar7,"-alsa");
            if ((iVar3 == 0) || (iVar3 = strcmp(pcVar7,"-alsamidi"), iVar3 == 0)) {
              pcVar11 = "Pd compiled without ALSA-support, ignoring \'%s\' flag\n";
              goto LAB_001763ee;
            }
            iVar3 = strcmp(pcVar7,"-alsaadd");
            if (iVar3 == 0) {
              if (argc == 1) goto LAB_00176be7;
              pcVar11 = "Pd compiled without ALSA-support, ignoring \'%s\' flag\n";
LAB_001763a8:
              fprintf(_stderr,pcVar11,pcVar7);
              goto LAB_00176241;
            }
            iVar3 = strcmp(pcVar7,"-jack");
            if (((iVar3 == 0) || (iVar3 = strcmp(pcVar7,"-jackconnect"), iVar3 == 0)) ||
               (iVar3 = strcmp(pcVar7,"-nojackconnect"), iVar3 == 0)) {
              pcVar11 = "Pd compiled without JACK-support, ignoring \'%s\' flag\n";
              goto LAB_001763ee;
            }
            iVar3 = strcmp(pcVar7,"-jackname");
            if (iVar3 == 0) {
              if (argc == 1) goto LAB_00176be7;
              pcVar11 = "Pd compiled without JACK-support, ignoring \'%s\' flag\n";
              goto LAB_001763a8;
            }
            iVar3 = strcmp(pcVar7,"-pa");
            if ((iVar3 == 0) || (iVar3 = strcmp(pcVar7,"-portaudio"), iVar3 == 0)) {
              pcVar11 = "Pd compiled without PortAudio-support, ignoring \'%s\' flag\n";
              goto LAB_001763ee;
            }
            iVar3 = strcmp(pcVar7,"-asio");
            if (iVar3 == 0) {
              pcVar11 = "Pd compiled without ASIO-support, ignoring \'%s\' flag\n";
              goto LAB_001763a8;
            }
            iVar3 = strcmp(pcVar7,"-mmio");
            if (iVar3 == 0) {
              pcVar11 = "Pd compiled without MMIO-support, ignoring \'%s\' flag\n";
              goto LAB_001763ee;
            }
            iVar3 = strcmp(pcVar7,"-audiounit");
            if (iVar3 == 0) {
              pcVar11 = "Pd compiled without AudioUnit-support, ignoring \'%s\' flag\n";
              goto LAB_001763ee;
            }
            iVar3 = strcmp(pcVar7,"-esd");
            if (iVar3 == 0) {
              pcVar11 = "Pd compiled without ESD-support, ignoring \'%s\' flag\n";
              goto LAB_001763ee;
            }
            iVar3 = strcmp(pcVar7,"-listdev");
            if (iVar3 == 0) {
              sys_listplease = 1;
              goto LAB_001763f8;
            }
            iVar3 = strcmp(pcVar7,"-soundindev");
            if ((iVar3 == 0) || (iVar3 = strcmp(pcVar7,"-audioindev"), iVar3 == 0)) {
              if (argc == 1) goto LAB_00176be7;
              pcVar7 = argv[1];
              piVar5 = &local_98.a_nindev;
              piVar12 = local_98.a_indevvec;
              goto LAB_0017622f;
            }
            iVar3 = strcmp(pcVar7,"-soundoutdev");
            if ((iVar3 == 0) || (iVar3 = strcmp(pcVar7,"-audiooutdev"), iVar3 == 0)) {
              if (argc == 1) goto LAB_00176be7;
LAB_0017642c:
              pcVar7 = argv[1];
              piVar5 = &local_98.a_noutdev;
              piVar12 = local_98.a_outdevvec;
              goto LAB_0017622f;
            }
            iVar3 = strcmp(pcVar7,"-sounddev");
            if ((iVar3 == 0) || (iVar3 = strcmp(pcVar7,"-audiodev"), iVar3 == 0)) {
              if ((argc == 1) ||
                 (iVar3 = sys_parsedevlist(&local_98.a_nindev,local_98.a_indevvec,4,argv[1]),
                 iVar3 == 0)) goto LAB_00176be7;
              goto LAB_0017642c;
            }
            iVar3 = strcmp(pcVar7,"-audioaddindev");
            if (iVar3 == 0) {
              if (argc == 1) goto LAB_00176be7;
              if (local_98.a_nindev < 0) {
                local_98.a_nindev = 0;
              }
              if (local_98.a_nindev < 4) {
                iVar3 = sys_audiodevnametonumber(0,argv[1]);
                if (iVar3 < 0) {
                  sys_argparse_cold_14();
                }
                else {
                  lVar8 = (long)local_98.a_nindev;
                  local_98.a_nindev = local_98.a_nindev + 1;
                  local_98.a_indevvec[lVar8] = iVar3 + 1;
                }
              }
              else {
                sys_argparse_cold_13();
              }
              goto LAB_00176241;
            }
            iVar3 = strcmp(pcVar7,"-audioaddoutdev");
            if (iVar3 == 0) {
              if (argc == 1) goto LAB_00176be7;
              if (local_98.a_noutdev < 0) {
                local_98.a_noutdev = 0;
              }
              if (local_98.a_noutdev < 4) {
                iVar3 = sys_audiodevnametonumber(1,argv[1]);
                if (iVar3 < 0) {
                  sys_argparse_cold_12();
                }
                else {
LAB_0017654e:
                  lVar8 = (long)local_98.a_noutdev;
                  local_98.a_noutdev = local_98.a_noutdev + 1;
                  local_98.a_outdevvec[lVar8] = iVar3 + 1;
                }
              }
              else {
                sys_argparse_cold_11();
              }
              goto LAB_00176241;
            }
            iVar3 = strcmp(pcVar7,"-audioadddev");
            if (iVar3 == 0) {
              if (argc == 1) goto LAB_00176be7;
              if (local_98.a_nindev < 0) {
                local_98.a_nindev = 0;
              }
              if (local_98.a_noutdev < 0) {
                local_98.a_noutdev = 0;
              }
              if ((local_98.a_nindev < 4) && (local_98.a_noutdev < 4)) {
                iVar3 = sys_audiodevnametonumber(0,argv[1]);
                if (iVar3 < 0) {
                  sys_argparse_cold_9();
                }
                else {
                  lVar8 = (long)local_98.a_nindev;
                  local_98.a_nindev = local_98.a_nindev + 1;
                  local_98.a_indevvec[lVar8] = iVar3 + 1;
                }
                iVar3 = sys_audiodevnametonumber(1,argv[1]);
                if (-1 < iVar3) goto LAB_0017654e;
                sys_argparse_cold_10();
              }
              else {
                sys_argparse_cold_8();
              }
              goto LAB_00176241;
            }
            iVar3 = strcmp(pcVar7,"-nomidiin");
            if (iVar3 == 0) {
              piVar5 = &sys_nmidiin;
LAB_00176575:
              *piVar5 = 0;
              goto LAB_001763f8;
            }
            iVar3 = strcmp(pcVar7,"-nomidiout");
            if (iVar3 == 0) {
              piVar5 = &sys_nmidiout;
              goto LAB_00176575;
            }
            iVar3 = strcmp(pcVar7,"-nomidi");
            if (iVar3 == 0) {
              sys_nmidiout = 0;
              sys_nmidiin = 0;
              goto LAB_001763f8;
            }
            iVar3 = strcmp(pcVar7,"-midiindev");
            if (iVar3 != 0) {
              iVar3 = strcmp(pcVar7,"-midioutdev");
              if (iVar3 == 0) {
                if (argc == 1) goto LAB_00176be7;
LAB_0017660a:
                pcVar7 = argv[1];
                piVar13 = &sys_nmidiout;
                piVar12 = &sys_nmidiout;
                piVar5 = sys_midioutdevlist;
                goto LAB_0017661f;
              }
              iVar3 = strcmp(pcVar7,"-mididev");
              if (iVar3 == 0) {
                if (argc == 1) goto LAB_00176be7;
                sys_parsedevlist(&sys_nmidiin,sys_midiindevlist,0x10,argv[1]);
                goto LAB_0017660a;
              }
              iVar3 = strcmp(pcVar7,"-midiaddindev");
              if (iVar3 == 0) {
                if (argc == 1) goto LAB_00176be7;
                if (sys_nmidiin < 0) {
                  sys_nmidiin = 0;
                }
                if (sys_nmidiin < 0x10) {
                  iVar3 = sys_mididevnametonumber(0,argv[1]);
                  if (iVar3 < 0) {
                    sys_argparse_cold_7();
                  }
                  else {
                    piVar5 = sys_midiindevlist;
                    iVar1 = sys_nmidiin;
                    sys_nmidiin = sys_nmidiin + 1;
LAB_001767d1:
                    piVar5[iVar1] = iVar3 + 1;
                  }
                }
                else {
                  sys_argparse_cold_6();
                }
                goto LAB_00176241;
              }
              iVar3 = strcmp(pcVar7,"-midiaddoutdev");
              if (iVar3 == 0) {
                if (argc == 1) goto LAB_00176be7;
                if (sys_nmidiout < 0) {
                  sys_nmidiout = 0;
                }
                if (sys_nmidiout < 0x10) {
                  iVar3 = sys_mididevnametonumber(1,argv[1]);
                  if (-1 < iVar3) {
LAB_001767b9:
                    piVar5 = sys_midioutdevlist;
                    iVar1 = sys_nmidiout;
                    sys_nmidiout = sys_nmidiout + 1;
                    goto LAB_001767d1;
                  }
                  sys_argparse_cold_5();
                }
                else {
                  sys_argparse_cold_4();
                }
                goto LAB_00176241;
              }
              iVar3 = strcmp(pcVar7,"-midiadddev");
              if (iVar3 == 0) {
                if (argc == 1) goto LAB_00176be7;
                if (sys_nmidiin < 0) {
                  sys_nmidiin = 0;
                }
                if (sys_nmidiout < 0) {
                  sys_nmidiout = 0;
                }
                if ((sys_nmidiin < 0x10) && (sys_nmidiout < 0x10)) {
                  iVar3 = sys_mididevnametonumber(1,argv[1]);
                  if (iVar3 < 0) {
                    sys_argparse_cold_2();
                  }
                  else {
                    lVar8 = (long)sys_nmidiin;
                    sys_nmidiin = sys_nmidiin + 1;
                    sys_midioutdevlist[lVar8] = iVar3 + 1;
                  }
                  iVar3 = sys_mididevnametonumber(1,argv[1]);
                  if (-1 < iVar3) goto LAB_001767b9;
                  sys_argparse_cold_3();
                }
                else {
                  sys_argparse_cold_1();
                }
                goto LAB_00176241;
              }
              iVar3 = strcmp(pcVar7,"-path");
              if (iVar3 == 0) {
                if (argc == 1) goto LAB_00176be7;
                ptVar4 = namelist_append_files((pd_maininstance.pd_stuff)->st_temppath,argv[1]);
                (pd_maininstance.pd_stuff)->st_temppath = ptVar4;
                goto LAB_00176241;
              }
              iVar3 = strcmp(pcVar7,"-nostdpath");
              if (iVar3 == 0) {
                piVar5 = &sys_usestdpath;
                goto LAB_00176575;
              }
              iVar3 = strcmp(pcVar7,"-stdpath");
              if (iVar3 == 0) {
                piVar5 = &sys_usestdpath;
                goto LAB_0017681a;
              }
              iVar3 = strcmp(pcVar7,"-helppath");
              if (iVar3 == 0) {
                if (argc == 1) goto LAB_00176be7;
                ptVar4 = namelist_append_files((pd_maininstance.pd_stuff)->st_helppath,argv[1]);
                (pd_maininstance.pd_stuff)->st_helppath = ptVar4;
                goto LAB_00176241;
              }
              iVar3 = strcmp(pcVar7,"-open");
              if (iVar3 == 0) {
                if (argc == 1) goto LAB_00176be7;
                sys_openlist = namelist_append_files(sys_openlist,argv[1]);
                goto LAB_00176241;
              }
              iVar3 = strcmp(pcVar7,"-lib");
              if (iVar3 == 0) {
                if (argc == 1) goto LAB_00176be7;
                ptVar4 = namelist_append_files((pd_maininstance.pd_stuff)->st_externlist,argv[1]);
                ppcVar9 = (char **)pd_maininstance.pd_stuff;
LAB_00176909:
                ((_instancestuff *)ppcVar9)->st_externlist = ptVar4;
                goto LAB_00176241;
              }
              iVar3 = strcmp(pcVar7,"-font-size");
              if ((iVar3 == 0) || (iVar3 = strcmp(pcVar7,"-font"), iVar3 == 0)) {
                if (argc == 1) goto LAB_00176be7;
                iVar3 = atoi(argv[1]);
                uVar6 = 0;
                ptVar10 = sys_fontspec;
                do {
                  ptVar10 = ptVar10 + 1;
                  if (iVar3 < ptVar10->fi_pointsize) goto LAB_001768c9;
                  uVar6 = uVar6 + 1;
                } while (uVar6 != 5);
                uVar6 = 5;
LAB_001768c9:
                iVar3 = sys_fontspec[uVar6].fi_pointsize;
                piVar5 = &sys_defaultfont;
                goto LAB_001762a3;
              }
              iVar3 = strcmp(pcVar7,"-font-face");
              if ((iVar3 == 0) || (iVar3 = strcmp(pcVar7,"-typeface"), iVar3 == 0)) {
                if (argc == 1) goto LAB_00176be7;
                strncpy(sys_font,argv[1],99);
                sys_font[99] = '\0';
                goto LAB_00176241;
              }
              iVar3 = strcmp(pcVar7,"-font-weight");
              if (iVar3 == 0) {
                if (argc == 1) goto LAB_00176be7;
                strncpy(sys_fontweight,argv[1],9);
                sys_fontweight[9] = '\0';
                goto LAB_00176241;
              }
              iVar3 = strcmp(pcVar7,"-verbose");
              if (iVar3 == 0) {
                sys_verbose = sys_verbose + 1;
                goto LAB_001763f8;
              }
              iVar3 = strcmp(pcVar7,"-noverbose");
              if (iVar3 == 0) {
                piVar5 = &sys_verbose;
                goto LAB_00176575;
              }
              iVar3 = strcmp(pcVar7,"-version");
              if (iVar3 == 0) {
                sys_version = 1;
                goto LAB_001763f8;
              }
              iVar3 = strcmp(pcVar7,"-d");
              if (((argc != 1) && (iVar3 == 0)) &&
                 (iVar3 = __isoc99_sscanf(argv[1],"%d",&sys_debuglevel), 0 < iVar3))
              goto LAB_00176241;
              pcVar7 = *argv;
              iVar3 = strcmp(pcVar7,"-loadbang");
              if (iVar3 == 0) {
                piVar5 = &sys_noloadbang;
                goto LAB_00176575;
              }
              iVar3 = strcmp(pcVar7,"-noloadbang");
              if (iVar3 == 0) {
                piVar5 = &sys_noloadbang;
                goto LAB_0017681a;
              }
              iVar3 = strcmp(pcVar7,"-gui");
              if (iVar3 == 0) {
                sys_dontstartgui = '\0';
                goto LAB_001763f8;
              }
              iVar3 = strcmp(pcVar7,"-nogui");
              if (iVar3 == 0) {
                sys_dontstartgui = '\x01';
                goto LAB_001763f8;
              }
              iVar3 = strcmp(pcVar7,"-guiport");
              if (((argc != 1) && (iVar3 == 0)) &&
                 (iVar3 = __isoc99_sscanf(argv[1],"%d",&sys_guisetportnumber), 0 < iVar3))
              goto LAB_00176241;
              pcVar7 = *argv;
              iVar3 = strcmp(pcVar7,"-nostderr");
              if (iVar3 == 0) {
                piVar5 = &sys_printtostderr;
                goto LAB_00176575;
              }
              iVar3 = strcmp(pcVar7,"-stderr");
              if (iVar3 == 0) {
                piVar5 = &sys_printtostderr;
                goto LAB_0017681a;
              }
              iVar3 = strcmp(pcVar7,"-guicmd");
              if (iVar3 == 0) {
                if (argc == 1) goto LAB_00176be7;
                ptVar4 = (t_namelist *)argv[1];
                ppcVar9 = &sys_guicmd;
                goto LAB_00176909;
              }
              iVar3 = strcmp(pcVar7,"-send");
              if (iVar3 == 0) {
                if (argc == 1) goto LAB_00176be7;
                sys_messagelist = namelist_append(sys_messagelist,argv[1],1);
                goto LAB_00176241;
              }
              iVar3 = strcmp(pcVar7,"-schedlib");
              if (iVar3 == 0) {
                if (argc == 1) goto LAB_00176be7;
                sys_externalschedlib = 1;
                strncpy(sys_externalschedlibname,argv[1],999);
                local_98.a_api = 0;
LAB_00176a9b:
                argv = argv + 2;
                argc = argc + -2;
              }
              else {
                iVar3 = strcmp(pcVar7,"-extraflags");
                if (iVar3 == 0) {
                  if (argc == 1) goto LAB_00176be7;
                  sys_extraflags = 1;
                  strncpy(sys_extraflagsstring,argv[1],999);
                  goto LAB_00176a9b;
                }
                iVar3 = strcmp(pcVar7,"-batch");
                if (iVar3 == 0) {
                  sys_batch = '\x01';
                  goto LAB_001763f8;
                }
                iVar3 = strcmp(pcVar7,"-nobatch");
                if (iVar3 == 0) {
                  sys_batch = '\0';
                  goto LAB_001763f8;
                }
                iVar3 = strcmp(pcVar7,"-autopatch");
                if (iVar3 == 0) {
                  piVar5 = &sys_noautopatch;
                  goto LAB_00176575;
                }
                iVar3 = strcmp(pcVar7,"-noautopatch");
                if (iVar3 == 0) {
                  piVar5 = &sys_noautopatch;
LAB_0017681a:
                  *piVar5 = 1;
                  goto LAB_001763f8;
                }
                iVar3 = strcmp(pcVar7,"-compatibility");
                if (iVar3 != 0) {
                  iVar3 = strcmp(pcVar7,"-rt");
                  if ((iVar3 != 0) && (iVar3 = strcmp(pcVar7,"-realtime"), iVar3 != 0)) {
                    iVar3 = strcmp(pcVar7,"-nrt");
                    if ((iVar3 == 0) ||
                       ((iVar3 = strcmp(pcVar7,"-nort"), iVar3 == 0 ||
                        (iVar3 = strcmp(pcVar7,"-norealtime"), iVar3 == 0)))) {
                      piVar5 = &sys_hipriority;
                    }
                    else {
                      iVar3 = strcmp(pcVar7,"-sleep");
                      if (iVar3 != 0) {
                        iVar3 = strcmp(pcVar7,"-nosleep");
                        if (iVar3 != 0) {
                          iVar3 = strcmp(pcVar7,"-noprefs");
                          if (iVar3 != 0) {
                            iVar3 = strcmp(pcVar7,"-prefsfile");
                            if ((argc == 1) || (iVar3 != 0)) goto LAB_00176be7;
                            goto LAB_00176241;
                          }
                          goto LAB_001763f8;
                        }
                        piVar5 = &sys_nosleep;
                        goto LAB_0017681a;
                      }
                      piVar5 = &sys_nosleep;
                    }
                    goto LAB_00176575;
                  }
                  piVar5 = &sys_hipriority;
                  goto LAB_0017681a;
                }
                if (argc == 1) {
                  argc = 1;
                  bVar2 = false;
                }
                else {
                  bVar2 = false;
                  iVar3 = __isoc99_sscanf(argv[1],"%f",&local_34);
                  if (0 < iVar3) {
                    pd_compatibilitylevel = (int)(local_34 * 100.0 + 0.5);
                    argv = argv + 2;
                    argc = argc + -2;
                    bVar2 = true;
                  }
                }
                if (!bVar2) goto LAB_00176be7;
              }
              goto LAB_00176248;
            }
            if (argc == 1) goto LAB_00176be7;
            pcVar7 = argv[1];
            piVar13 = &sys_nmidiin;
            piVar12 = &sys_nmidiin;
            piVar5 = sys_midiindevlist;
LAB_0017661f:
            sys_parsedevlist(piVar12,piVar5,0x10,pcVar7);
            iVar3 = *piVar13;
            goto joined_r0x0017662d;
          }
          local_98.a_blocksize = atoi(argv[1]);
          goto LAB_00176241;
        }
        local_98.a_callback = 1;
LAB_001763f8:
        argc = argc + -1;
        argv = argv + 1;
      }
LAB_00176248:
    } while (0 < argc);
  }
  if (sys_batch == '\x01') {
    sys_dontstartgui = '\x01';
  }
  if (sys_dontstartgui == '\x01') {
    sys_printtostderr = 1;
  }
  if (sys_defaultfont == 0) {
    sys_defaultfont = 0xc;
  }
  if (0 < argc) {
    iVar3 = argc + 1;
    do {
      sys_openlist = namelist_append_files(sys_openlist,*argv);
      argv = argv + 1;
      iVar3 = iVar3 + -1;
    } while (1 < iVar3);
  }
  sys_set_audio_settings(&local_98);
  return 0;
}

Assistant:

int sys_argparse(int argc, const char **argv)
{
    t_audiosettings as;
            /* get the current audio parameters.  These are set
            by the preferences mechanism (sys_loadpreferences()) or
            else are the default.  Overwrite them with any results
            of argument parsing, and store them again. */
    sys_get_audio_settings(&as);
    while ((argc > 0) && **argv == '-')
    {
                /* audio flags */
        if (!strcmp(*argv, "-r") && argc > 1 &&
            sscanf(argv[1], "%d", &as.a_srate) >= 1)
        {
            argc -= 2;
            argv += 2;
        }
        else if (!strcmp(*argv, "-inchannels"))
        {
            if (argc < 2 ||
                !sys_parsedevlist(&as.a_nchindev,
                    as.a_chindevvec, MAXAUDIOINDEV, argv[1]))
                        goto usage;
            argc -= 2; argv += 2;
        }
        else if (!strcmp(*argv, "-outchannels"))
        {
            if (argc < 2 ||
                !sys_parsedevlist(&as.a_nchoutdev,
                    as.a_choutdevvec, MAXAUDIOINDEV, argv[1]))
                        goto usage;
            argc -= 2; argv += 2;
        }
        else if (!strcmp(*argv, "-channels"))
        {
            if (argc < 2 ||
                !sys_parsedevlist(&as.a_nchindev,
                    as.a_chindevvec, MAXAUDIOINDEV, argv[1]) ||
                !sys_parsedevlist(&as.a_nchoutdev,
                    as.a_choutdevvec, MAXAUDIOINDEV, argv[1]))
                        goto usage;
            argc -= 2; argv += 2;
        }
        else if (!strcmp(*argv, "-soundbuf") || (!strcmp(*argv, "-audiobuf")))
        {
            if (argc < 2)
                goto usage;

            as.a_advance = atoi(argv[1]);
            argc -= 2; argv += 2;
        }
        else if (!strcmp(*argv, "-callback"))
        {
            as.a_callback = 1;
            argc--; argv++;
        }
        else if (!strcmp(*argv, "-nocallback"))
        {
            as.a_callback = 0;
            argc--; argv++;
        }
        else if (!strcmp(*argv, "-blocksize"))
        {
            as.a_blocksize = atoi(argv[1]);
            argc -= 2; argv += 2;
        }
        else if (!strcmp(*argv, "-sleepgrain"))
        {
            if (argc < 2)
                goto usage;
            sys_sleepgrain = 1000 * atof(argv[1]);
            argc -= 2; argv += 2;
        }
        else if (!strcmp(*argv, "-nodac"))
        {
            as.a_noutdev = as.a_nchoutdev = 0;
            argc--; argv++;
        }
        else if (!strcmp(*argv, "-noadc"))
        {
            as.a_nindev = as.a_nchindev = 0;
            argc--; argv++;
        }
        else if (!strcmp(*argv, "-nosound") || !strcmp(*argv, "-noaudio"))
        {
            as.a_noutdev = as.a_nchoutdev =  as.a_nindev = as.a_nchindev = 0;
            argc--; argv++;
        }
#ifdef USEAPI_OSS
        else if (!strcmp(*argv, "-oss"))
        {
            as.a_api = API_OSS;
            argc--; argv++;
        }
        else if (!strcmp(*argv, "-ossmidi"))
        {
            sys_set_midi_api(API_OSS);
            argc--; argv++;
        }
#else
        else if ((!strcmp(*argv, "-oss")) || (!strcmp(*argv, "-ossmidi")))
        {
            fprintf(stderr, "Pd compiled without OSS-support, ignoring '%s' flag\n", *argv);
            argc--; argv++;
        }
#endif
#ifdef USEAPI_ALSA
        else if (!strcmp(*argv, "-alsa"))
        {
            as.a_api = API_ALSA;
            argc--; argv++;
        }
        else if (!strcmp(*argv, "-alsaadd"))
        {
            if (argc < 2)
                goto usage;
            as.a_api = API_ALSA;
            alsa_adddev(argv[1]);
            argc -= 2; argv +=2;
        }
        else if (!strcmp(*argv, "-alsamidi"))
        {
            sys_set_midi_api(API_ALSA);
            argc--; argv++;
        }
#else
        else if ((!strcmp(*argv, "-alsa")) || (!strcmp(*argv, "-alsamidi")))
        {
            fprintf(stderr, "Pd compiled without ALSA-support, ignoring '%s' flag\n", *argv);
            argc--; argv++;
        }
        else if (!strcmp(*argv, "-alsaadd"))
        {
            if (argc < 2)
                goto usage;
            fprintf(stderr, "Pd compiled without ALSA-support, ignoring '%s' flag\n", *argv);
            argc -= 2; argv +=2;
        }
#endif
#ifdef USEAPI_JACK
        else if (!strcmp(*argv, "-jack"))
        {
            as.a_api = API_JACK;
            argc--; argv++;
        }
        else if (!strcmp(*argv, "-nojackconnect"))
        {
            as.a_api = API_JACK;
            jack_autoconnect(0);
            argc--; argv++;
        }
        else if (!strcmp(*argv, "-jackconnect"))
        {
            as.a_api = API_JACK;
            jack_autoconnect(1);
            argc--; argv++;
        }
        else if (!strcmp(*argv, "-jackname"))
        {
            if (argc < 2)
                goto usage;
            as.a_api = API_JACK;
            jack_client_name(argv[1]);
            argc -= 2; argv +=2;
        }
#else
        else if ((!strcmp(*argv, "-jack"))
            || (!strcmp(*argv, "-jackconnect"))
            || (!strcmp(*argv, "-nojackconnect")))
        {
            fprintf(stderr, "Pd compiled without JACK-support, ignoring '%s' flag\n", *argv);
            argc--; argv++;
        }
        else if (!strcmp(*argv, "-jackname"))
        {
            if (argc < 2)
                goto usage;
            fprintf(stderr, "Pd compiled without JACK-support, ignoring '%s' flag\n", *argv);
            argc -= 2; argv +=2;
        }
#endif
#ifdef USEAPI_PORTAUDIO
        else if (!strcmp(*argv, "-pa") || !strcmp(*argv, "-portaudio")
            || !strcmp(*argv, "-asio"))
        {
            as.a_api = API_PORTAUDIO;
            sys_mmio = 0;
            argc--; argv++;
        }
#else
        else if ((!strcmp(*argv, "-pa")) || (!strcmp(*argv, "-portaudio")))
        {
            fprintf(stderr, "Pd compiled without PortAudio-support, ignoring '%s' flag\n", *argv);
            argc--; argv++;
        }
        else if (!strcmp(*argv, "-asio"))
        {
            fprintf(stderr, "Pd compiled without ASIO-support, ignoring '%s' flag\n", *argv);
            argc -= 2; argv +=2;
        }
#endif
#ifdef USEAPI_MMIO
        else if (!strcmp(*argv, "-mmio"))
        {
            as.a_api = API_MMIO;
            sys_mmio = 1;
            argc--; argv++;
        }
#else
        else if (!strcmp(*argv, "-mmio"))
        {
            fprintf(stderr, "Pd compiled without MMIO-support, ignoring '%s' flag\n", *argv);
            argc--; argv++;
        }
#endif
#ifdef USEAPI_AUDIOUNIT
        else if (!strcmp(*argv, "-audiounit"))
        {
            as.a_api = API_AUDIOUNIT;
            argc--; argv++;
        }
#else
        else if (!strcmp(*argv, "-audiounit"))
        {
            fprintf(stderr, "Pd compiled without AudioUnit-support, ignoring '%s' flag\n", *argv);
            argc--; argv++;
        }
#endif
#ifdef USEAPI_ESD
        else if (!strcmp(*argv, "-esd"))
        {
            as.a_api = API_ESD;
            argc--; argv++;
        }
#else
        else if (!strcmp(*argv, "-esd"))
        {
            fprintf(stderr, "Pd compiled without ESD-support, ignoring '%s' flag\n", *argv);
            argc--; argv++;
        }
#endif
        else if (!strcmp(*argv, "-listdev"))
        {
            sys_listplease = 1;
            argc--; argv++;
        }
        else if (!strcmp(*argv, "-soundindev") ||
            !strcmp(*argv, "-audioindev"))
        {
            if (argc < 2 ||
                !sys_parsedevlist(&as.a_nindev, as.a_indevvec,
                    MAXAUDIOINDEV, argv[1]))
                        goto usage;
            argc -= 2; argv += 2;
        }
        else if (!strcmp(*argv, "-soundoutdev") ||
            !strcmp(*argv, "-audiooutdev"))
        {
            if (argc < 2 ||
                !sys_parsedevlist(&as.a_noutdev, as.a_outdevvec,
                    MAXAUDIOOUTDEV, argv[1]))
                        goto usage;
            argc -= 2; argv += 2;
        }
        else if ((!strcmp(*argv, "-sounddev") || !strcmp(*argv, "-audiodev")))
        {
            if (argc < 2 ||
                !sys_parsedevlist(&as.a_nindev, as.a_indevvec,
                    MAXAUDIOINDEV, argv[1]) ||
                !sys_parsedevlist(&as.a_noutdev, as.a_outdevvec,
                    MAXAUDIOOUTDEV, argv[1]))
                        goto usage;
            argc -= 2; argv += 2;
        }
        else if (!strcmp(*argv, "-audioaddindev"))
        {
            if (argc < 2)
                goto usage;

            if (as.a_nindev < 0)
                as.a_nindev = 0;
            if (as.a_nindev < MAXAUDIOINDEV)
            {
                int devn = sys_audiodevnametonumber(0, argv[1]);
                if (devn < 0)
                    fprintf(stderr, "Couldn't find audio input device: %s\n",
                        argv[1]);
                else as.a_indevvec[as.a_nindev++] = devn + 1;
            }
            else fprintf(stderr, "number of audio devices limited to %d\n",
                MAXAUDIOINDEV);
            argc -= 2; argv += 2;
        }
        else if (!strcmp(*argv, "-audioaddoutdev"))
        {
            if (argc < 2)
                goto usage;

            if (as.a_noutdev < 0)
                as.a_noutdev = 0;
            if (as.a_noutdev < MAXAUDIOINDEV)
            {
                int devn = sys_audiodevnametonumber(1, argv[1]);
                if (devn < 0)
                    fprintf(stderr, "Couldn't find audio output device: %s\n",
                        argv[1]);
                else as.a_outdevvec[as.a_noutdev++] = devn + 1;
            }
            else fprintf(stderr, "number of audio devices limited to %d\n",
                MAXAUDIOINDEV);
            argc -= 2; argv += 2;
        }
        else if (!strcmp(*argv, "-audioadddev"))
        {
            if (argc < 2)
                goto usage;

            if (as.a_nindev < 0)
                as.a_nindev = 0;
            if (as.a_noutdev < 0)
                as.a_noutdev = 0;
            if (as.a_nindev < MAXAUDIOINDEV && as.a_noutdev < MAXAUDIOINDEV)
            {
                int devn = sys_audiodevnametonumber(0, argv[1]);
                if (devn < 0)
                    fprintf(stderr, "Couldn't find audio input device: %s\n",
                        argv[1]);
                else as.a_indevvec[as.a_nindev++] = devn + 1;
                devn = sys_audiodevnametonumber(1, argv[1]);
                if (devn < 0)
                    fprintf(stderr, "Couldn't find audio output device: %s\n",
                        argv[1]);
                else as.a_outdevvec[as.a_noutdev++] = devn + 1;
            }
            else fprintf(stderr, "number of audio devices limited to %d",
                MAXAUDIOINDEV);
            argc -= 2; argv += 2;
        }
                /* MIDI flags */
        else if (!strcmp(*argv, "-nomidiin"))
        {
            sys_nmidiin = 0;
            argc--; argv++;
        }
        else if (!strcmp(*argv, "-nomidiout"))
        {
            sys_nmidiout = 0;
            argc--; argv++;
        }
        else if (!strcmp(*argv, "-nomidi"))
        {
            sys_nmidiin = sys_nmidiout = 0;
            argc--; argv++;
        }
        else if (!strcmp(*argv, "-midiindev"))
        {
            if (argc < 2)
                goto usage;

            sys_parsedevlist(&sys_nmidiin, sys_midiindevlist, MAXMIDIINDEV,
                argv[1]);
            if (!sys_nmidiin)
                goto usage;
            argc -= 2; argv += 2;
        }
        else if (!strcmp(*argv, "-midioutdev"))
        {
            if (argc < 2)
                goto usage;

            sys_parsedevlist(&sys_nmidiout, sys_midioutdevlist, MAXMIDIOUTDEV,
                argv[1]);
            if (!sys_nmidiout)
                goto usage;
            argc -= 2; argv += 2;
        }
        else if (!strcmp(*argv, "-mididev"))
        {
            if (argc < 2)
                goto usage;

            sys_parsedevlist(&sys_nmidiin, sys_midiindevlist, MAXMIDIINDEV,
                argv[1]);
            sys_parsedevlist(&sys_nmidiout, sys_midioutdevlist, MAXMIDIOUTDEV,
                argv[1]);
            if (!sys_nmidiout)
                goto usage;
            argc -= 2; argv += 2;
        }
        else if (!strcmp(*argv, "-midiaddindev"))
        {
            if (argc < 2)
                goto usage;

            if (sys_nmidiin < 0)
                sys_nmidiin = 0;
            if (sys_nmidiin < MAXMIDIINDEV)
            {
                int devn = sys_mididevnametonumber(0, argv[1]);
                if (devn < 0)
                    fprintf(stderr, "Couldn't find MIDI input device: %s\n",
                        argv[1]);
                else sys_midiindevlist[sys_nmidiin++] = devn + 1;
            }
            else fprintf(stderr, "number of MIDI devices limited to %d\n",
                MAXMIDIINDEV);
            argc -= 2; argv += 2;
        }
        else if (!strcmp(*argv, "-midiaddoutdev"))
        {
            if (argc < 2)
                goto usage;

            if (sys_nmidiout < 0)
                sys_nmidiout = 0;
            if (sys_nmidiout < MAXMIDIINDEV)
            {
                int devn = sys_mididevnametonumber(1, argv[1]);
                if (devn < 0)
                    fprintf(stderr, "Couldn't find MIDI output device: %s\n",
                        argv[1]);
                else sys_midioutdevlist[sys_nmidiout++] = devn + 1;
            }
            else fprintf(stderr, "number of MIDI devices limited to %d\n",
                MAXMIDIINDEV);
            argc -= 2; argv += 2;
        }
        else if (!strcmp(*argv, "-midiadddev"))
        {
            if (argc < 2)
                goto usage;

            if (sys_nmidiin < 0)
                sys_nmidiin = 0;
            if (sys_nmidiout < 0)
                sys_nmidiout = 0;
            if (sys_nmidiin < MAXMIDIINDEV && sys_nmidiout < MAXMIDIINDEV)
            {
                int devn = sys_mididevnametonumber(1, argv[1]);
                if (devn < 0)
                    fprintf(stderr, "Couldn't find MIDI output device: %s\n",
                        argv[1]);
                else sys_midioutdevlist[sys_nmidiin++] = devn + 1;
                devn = sys_mididevnametonumber(1, argv[1]);
                if (devn < 0)
                    fprintf(stderr, "Couldn't find MIDI output device: %s\n",
                        argv[1]);
                else sys_midioutdevlist[sys_nmidiout++] = devn + 1;
            }
            else fprintf(stderr, "number of MIDI devices limited to %d",
                MAXMIDIINDEV);
            argc -= 2; argv += 2;
        }
                /* other flags */
        else if (!strcmp(*argv, "-path"))
        {
            if (argc < 2)
                goto usage;
            STUFF->st_temppath =
                namelist_append_files(STUFF->st_temppath, argv[1]);
            argc -= 2; argv += 2;
        }
        else if (!strcmp(*argv, "-nostdpath"))
        {
            sys_usestdpath = 0;
            argc--; argv++;
        }
        else if (!strcmp(*argv, "-stdpath"))
        {
            sys_usestdpath = 1;
            argc--; argv++;
        }
        else if (!strcmp(*argv, "-helppath"))
        {
            if (argc < 2)
                goto usage;
            STUFF->st_helppath =
                namelist_append_files(STUFF->st_helppath, argv[1]);
            argc -= 2; argv += 2;
        }
        else if (!strcmp(*argv, "-open"))
        {
            if (argc < 2)
                goto usage;

            sys_openlist = namelist_append_files(sys_openlist, argv[1]);
            argc -= 2; argv += 2;
        }
        else if (!strcmp(*argv, "-lib"))
        {
            if (argc < 2)
                goto usage;

            STUFF->st_externlist =
                namelist_append_files(STUFF->st_externlist, argv[1]);
            argc -= 2; argv += 2;
        }
        else if ((!strcmp(*argv, "-font-size") || !strcmp(*argv, "-font")))
        {
            if (argc < 2)
                goto usage;

            sys_defaultfont = sys_nearestfontsize(atoi(argv[1]));
            argc -= 2;
            argv += 2;
        }
        else if ((!strcmp(*argv, "-font-face") || !strcmp(*argv, "-typeface")))
        {
            if (argc < 2)
                goto usage;

            strncpy(sys_font,*(argv+1),sizeof(sys_font)-1);
            sys_font[sizeof(sys_font)-1] = 0;
            argc -= 2;
            argv += 2;
        }
        else if (!strcmp(*argv, "-font-weight"))
        {
            if (argc < 2)
                goto usage;

            strncpy(sys_fontweight,*(argv+1),sizeof(sys_fontweight)-1);
            sys_fontweight[sizeof(sys_fontweight)-1] = 0;
            argc -= 2;
            argv += 2;
        }
        else if (!strcmp(*argv, "-verbose"))
        {
            sys_verbose++;
            argc--; argv++;
        }
        else if (!strcmp(*argv, "-noverbose"))
        {
            sys_verbose=0;
            argc--; argv++;
        }
        else if (!strcmp(*argv, "-version"))
        {
            sys_version = 1;
            argc--; argv++;
        }
        else if (!strcmp(*argv, "-d") && argc > 1 &&
            sscanf(argv[1], "%d", &sys_debuglevel) >= 1)
        {
            argc -= 2;
            argv += 2;
        }
        else if (!strcmp(*argv, "-loadbang"))
        {
            sys_noloadbang = 0;
            argc--; argv++;
        }
        else if (!strcmp(*argv, "-noloadbang"))
        {
            sys_noloadbang = 1;
            argc--; argv++;
        }
        else if (!strcmp(*argv, "-gui"))
        {
            sys_dontstartgui = 0;
            argc--; argv++;
        }
        else if (!strcmp(*argv, "-nogui"))
        {
            sys_dontstartgui = 1;
            argc--; argv++;
        }
        else if (!strcmp(*argv, "-guiport") && argc > 1 &&
            sscanf(argv[1], "%d", &sys_guisetportnumber) >= 1)
        {
            argc -= 2;
            argv += 2;
        }
        else if (!strcmp(*argv, "-nostderr"))
        {
            sys_printtostderr = 0;
            argc--; argv++;
        }
        else if (!strcmp(*argv, "-stderr"))
        {
            sys_printtostderr = 1;
            argc--; argv++;
        }
        else if (!strcmp(*argv, "-guicmd"))
        {
            if (argc < 2)
                goto usage;

            sys_guicmd = argv[1];
            argc -= 2; argv += 2;
        }
        else if (!strcmp(*argv, "-send"))
        {
            if (argc < 2)
                goto usage;

            sys_messagelist = namelist_append(sys_messagelist, argv[1], 1);
            argc -= 2; argv += 2;
        }
        else if (!strcmp(*argv, "-schedlib"))
        {
            if (argc < 2)
                goto usage;

            sys_externalschedlib = 1;
            strncpy(sys_externalschedlibname, argv[1],
                sizeof(sys_externalschedlibname) - 1);
#ifndef  __APPLE__
                /* no audio I/O please, unless overwritten by later args.
                This is to circumvent a problem running pd~ subprocesses
                with -nogui; they would open an audio device before pdsched.c
                could set the API to nothing.  For some reason though, on
                MACOSX this causes Pd to switch to JACK so we just give up
                and suppress the workaround there. */
            as.a_api = 0;
#endif
            argv += 2;
            argc -= 2;
        }
        else if (!strcmp(*argv, "-extraflags"))
        {
            if (argc < 2)
                goto usage;

            sys_extraflags = 1;
            strncpy(sys_extraflagsstring, argv[1],
                sizeof(sys_extraflagsstring) - 1);
            argv += 2;
            argc -= 2;
        }
        else if (!strcmp(*argv, "-batch"))
        {
            sys_batch = 1;
            argc--; argv++;
        }
        else if (!strcmp(*argv, "-nobatch"))
        {
            sys_batch = 0;
            argc--; argv++;
        }
        else if (!strcmp(*argv, "-autopatch"))
        {
            sys_noautopatch = 0;
            argc--; argv++;
        }
        else if (!strcmp(*argv, "-noautopatch"))
        {
            sys_noautopatch = 1;
            argc--; argv++;
        }
        else if (!strcmp(*argv, "-compatibility"))
        {
            float f;
            if (argc < 2)
                goto usage;

            if (sscanf(argv[1], "%f", &f) < 1)
                goto usage;
            pd_compatibilitylevel = 0.5 + 100. * f; /* e.g., 2.44 --> 244 */
            argv += 2;
            argc -= 2;
        }
#ifdef HAVE_UNISTD_H
        else if (!strcmp(*argv, "-rt") || !strcmp(*argv, "-realtime"))
        {
            sys_hipriority = 1;
            argc--; argv++;
        }
        else if (!strcmp(*argv, "-nrt") || !strcmp(*argv, "-nort") || !strcmp(*argv, "-norealtime"))
        {
            sys_hipriority = 0;
            argc--; argv++;
        }
#else
        else if (!strcmp(*argv, "-rt") || !strcmp(*argv, "-realtime")
                 || !strcmp(*argv, "-nrt") || !strcmp(*argv, "-nort")
                 || !strcmp(*argv, "-norealtime"))
        {
            fprintf(stderr, "Pd compiled without realtime priority-support, ignoring '%s' flag\n", *argv);
            argc--; argv++;
        }
#endif
        else if (!strcmp(*argv, "-sleep"))
        {
            sys_nosleep = 0;
            argc--; argv++;
        }
        else if (!strcmp(*argv, "-nosleep"))
        {
            sys_nosleep = 1;
            argc--; argv++;
        }
        else if (!strcmp(*argv, "-noprefs")) /* did this earlier */
            argc--, argv++;
        else if (!strcmp(*argv, "-prefsfile") && argc > 1) /* this too */
            argc -= 2, argv +=2;
        else
        {
        usage:
            sys_printusage();
            return (1);
        }
    }
    if (sys_batch)
        sys_dontstartgui = 1;
    if (sys_dontstartgui)
        sys_printtostderr = 1;
#ifdef _WIN32
    if (sys_printtostderr)
        /* we need to tell Windows to output UTF-8 */
        SetConsoleOutputCP(CP_UTF8);
#endif
    if (!sys_defaultfont)
        sys_defaultfont = DEFAULTFONT;
    for (; argc > 0; argc--, argv++)
        sys_openlist = namelist_append_files(sys_openlist, *argv);

    sys_set_audio_settings(&as);
    return (0);
}